

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleTable::childAt(QAccessibleTable *this,int x,int y)

{
  QAccessibleObject *pQVar1;
  Representation RVar2;
  int iVar3;
  int iVar4;
  QAbstractScrollArea *this_00;
  QWidget *pQVar5;
  QWidget *parent;
  QPoint QVar6;
  long *plVar7;
  QListView *this_01;
  QHeaderView *pQVar8;
  QHeaderView *pQVar9;
  QAccessibleInterface *pQVar10;
  Representation RVar11;
  long in_FS_OFFSET;
  QPoint local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractScrollArea *)
            QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar5 = QAbstractScrollArea::viewport(this_00);
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  parent = (QWidget *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  local_58.xp.m_i = 0;
  local_58.yp.m_i = 0;
  QVar6 = QWidget::mapTo(pQVar5,parent,&local_58);
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  local_58.xp.m_i = x - QVar6.xp.m_i;
  local_58.yp.m_i = y - QVar6.yp.m_i;
  local_40 = QWidget::mapFromGlobal(pQVar5,&local_58);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.xp.m_i = -0x55555556;
  local_58.yp.m_i = -0x55555556;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  plVar7 = (long *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  (**(code **)(*plVar7 + 0x1f0))(&local_58,plVar7,&local_40);
  RVar2.m_i = local_58.yp.m_i;
  pQVar10 = (QAccessibleInterface *)0x0;
  if (((-1 < local_58.xp.m_i) && (-1 < local_58.yp.m_i)) && (local_48 != (undefined1 *)0x0)) {
    if (this->m_role == List) {
      (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
      QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
      this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
      iVar3 = QListView::modelColumn(this_01);
      RVar11.m_i = -1;
      if (RVar2.m_i == iVar3) {
        RVar11.m_i = local_58.xp.m_i;
      }
    }
    else {
      pQVar8 = verticalHeader(this);
      pQVar9 = horizontalHeader(this);
      iVar3 = local_58.xp.m_i + 1;
      iVar4 = (**(code **)(*(long *)this + 0x58))(this);
      RVar11.m_i = (uint)(pQVar8 != (QHeaderView *)0x0) + local_58.yp.m_i +
                   (iVar4 + (uint)(pQVar8 != (QHeaderView *)0x0)) *
                   (iVar3 - (uint)(pQVar9 == (QHeaderView *)0x0));
    }
    pQVar10 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,RVar11.m_i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar10;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::childAt(int x, int y) const
{
    QPoint viewportOffset = view()->viewport()->mapTo(view(), QPoint(0,0));
    QPoint indexPosition = view()->mapFromGlobal(QPoint(x, y) - viewportOffset);
    // FIXME: if indexPosition < 0 in one coordinate, return header

    const QModelIndex index = view()->indexAt(indexPosition);
    if (index.isValid())
        return child(logicalIndex(index));
    return nullptr;
}